

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_generation_test.cpp
# Opt level: O2

void parseArgs(int argc,char **argv,uint *textures,uint *start,string *output,uint *resolution,
              string *type)

{
  int iVar1;
  uint uVar2;
  ostream *poVar3;
  string local_68;
  uint *local_48;
  string *local_40;
  uint *local_38;
  
  local_48 = resolution;
  local_40 = output;
  local_38 = start;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            iVar1 = getopt(argc,argv,"d: t: n: s: i: r:");
            if (iVar1 != 100) break;
            std::__cxx11::string::assign((char *)local_40);
          }
          if (iVar1 != 0x69) break;
          uVar2 = atoi(_optarg);
          *local_38 = uVar2;
        }
        if (iVar1 != 0x6e) break;
        uVar2 = atoi(_optarg);
        *textures = uVar2;
      }
      if (iVar1 != 0x72) break;
      uVar2 = atoi(_optarg);
      *local_48 = uVar2;
    }
    if (iVar1 != 0x74) break;
    std::__cxx11::string::assign((char *)type);
  }
  if (iVar1 == -1) {
    return;
  }
  getUsage_abi_cxx11_(&local_68,*argv);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)&local_68);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&local_68);
  exit(1);
}

Assistant:

void parseArgs(
    int argc,
    char** argv,
    unsigned int & textures,
    unsigned int & start,
    std::string & output,
    unsigned int & resolution,
    std::string & type)
{
    int opt;
    bool d, t, i, s, r;

    while ( (opt = getopt(argc,argv,"d: t: n: s: i: r:")) != EOF)
    {
        switch (opt)
        {
            case 'd':
                d=true; output = optarg; break;
            case 't':
                t=true; type = optarg; break;
            case 'n':
                s=true; textures = atoi(optarg); break;
            case 'i':
                i=true; start = atoi(optarg); break;
            case 'r':
                r=true; resolution = atoi(optarg); break;
            default:
                std::cout << getUsage(argv[0]) << std::endl;
                exit(EXIT_FAILURE);
        }
    }

    // If arg was not set then assign default values
    if (!s) textures    = ARG_TEXTURES_DEFAULT;
    if (!d) output      = ARG_OUTPUT_DIR_DEFAULT;
    if (!r) resolution  = ARG_IMG_RESOLUTION_DEFAULT;
    if (!i) start       = ARG_START_DEFAULT;
    if (!t) type        = ARG_TYPE_DEFAULT;
}